

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int ExpandColorMap(int num_colors,VP8LTransform *transform)

{
  undefined4 uVar1;
  long lVar2;
  undefined4 *puVar3;
  long in_RSI;
  int in_EDI;
  uint8_t *new_data;
  uint8_t *data;
  uint32_t *new_color_map;
  int final_num_colors;
  int i;
  size_t in_stack_ffffffffffffffd0;
  uint64_t in_stack_ffffffffffffffd8;
  undefined4 local_14;
  undefined4 local_4;
  
  uVar1 = *(undefined4 *)(in_RSI + 4);
  puVar3 = (undefined4 *)WebPSafeMalloc(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (puVar3 == (undefined4 *)0x0) {
    local_4 = 0;
  }
  else {
    lVar2 = *(long *)(in_RSI + 0x10);
    *puVar3 = **(undefined4 **)(in_RSI + 0x10);
    for (local_14 = 4; local_14 < in_EDI * 4; local_14 = local_14 + 1) {
      *(char *)((long)puVar3 + (long)local_14) =
           *(char *)(lVar2 + local_14) + *(char *)((long)puVar3 + (long)(local_14 + -4));
    }
    for (; local_14 < (1 << ((byte)(8 >> ((byte)uVar1 & 0x1f)) & 0x1f)) * 4; local_14 = local_14 + 1
        ) {
      *(undefined1 *)((long)puVar3 + (long)local_14) = 0;
    }
    WebPSafeFree((void *)0x1153a1);
    *(undefined4 **)(in_RSI + 0x10) = puVar3;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int ExpandColorMap(int num_colors, VP8LTransform* const transform) {
  int i;
  const int final_num_colors = 1 << (8 >> transform->bits_);
  uint32_t* const new_color_map =
      (uint32_t*)WebPSafeMalloc((uint64_t)final_num_colors,
                                sizeof(*new_color_map));
  if (new_color_map == NULL) {
    return 0;
  } else {
    uint8_t* const data = (uint8_t*)transform->data_;
    uint8_t* const new_data = (uint8_t*)new_color_map;
    new_color_map[0] = transform->data_[0];
    for (i = 4; i < 4 * num_colors; ++i) {
      // Equivalent to AddPixelEq(), on a byte-basis.
      new_data[i] = (data[i] + new_data[i - 4]) & 0xff;
    }
    for (; i < 4 * final_num_colors; ++i) {
      new_data[i] = 0;  // black tail.
    }
    WebPSafeFree(transform->data_);
    transform->data_ = new_color_map;
  }
  return 1;
}